

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

timespec __thiscall absl::lts_20250127::ToTimespec(lts_20250127 *this,Duration d)

{
  Duration lhs;
  timespec tVar1;
  bool bVar2;
  uint32_t uVar3;
  undefined8 extraout_RDX;
  Duration DVar4;
  Duration d_00;
  Duration d_01;
  uint local_78;
  uint32_t rep_lo;
  int64_t local_58;
  int64_t rep_hi;
  Duration d_local;
  timespec ts;
  undefined8 extraout_RDX_00;
  
  d_00.rep_hi_.lo_ = d.rep_hi_.lo_;
  DVar4.rep_lo_ = d_00.rep_hi_.lo_;
  DVar4.rep_hi_ = (HiRep)this;
  bVar2 = time_internal::IsInfiniteDuration(DVar4);
  if (bVar2) {
    DVar4 = ZeroDuration();
    lhs.rep_lo_ = d_00.rep_hi_.lo_;
    lhs.rep_hi_ = (HiRep)this;
    bVar2 = operator>=(lhs,DVar4);
    if (bVar2) {
      d_local._4_8_ = std::numeric_limits<long>::max();
      ts.tv_sec = 999999999;
    }
    else {
      d_local._4_8_ = std::numeric_limits<long>::min();
      ts.tv_sec = 0;
    }
  }
  else {
    d_00.rep_hi_.hi_ = 0;
    d_00.rep_lo_ = (uint32_t)extraout_RDX;
    local_58 = time_internal::GetRepHi((time_internal *)this,d_00);
    d_01.rep_hi_.hi_ = 0;
    d_01.rep_hi_.lo_ = d_00.rep_hi_.lo_;
    d_01.rep_lo_ = (uint32_t)extraout_RDX_00;
    uVar3 = time_internal::GetRepLo((time_internal *)this,d_01);
    local_78 = uVar3;
    if ((local_58 < 0) && (local_78 = uVar3 + 3, 3999999999 < local_78)) {
      local_58 = local_58 + 1;
      local_78 = uVar3 + 0x1194d803;
    }
    d_local.rep_hi_.hi_ = (undefined4)local_58;
    d_local.rep_lo_ = local_58._4_4_;
    ts.tv_sec = (ulong)local_78 / 4;
  }
  tVar1.tv_nsec = ts.tv_sec;
  tVar1.tv_sec._0_4_ = d_local.rep_hi_.hi_;
  tVar1.tv_sec._4_4_ = d_local.rep_lo_;
  return tVar1;
}

Assistant:

timespec ToTimespec(Duration d) {
  timespec ts;
  if (!time_internal::IsInfiniteDuration(d)) {
    int64_t rep_hi = time_internal::GetRepHi(d);
    uint32_t rep_lo = time_internal::GetRepLo(d);
    if (rep_hi < 0) {
      // Tweak the fields so that unsigned division of rep_lo
      // maps to truncation (towards zero) for the timespec.
      rep_lo += kTicksPerNanosecond - 1;
      if (rep_lo >= kTicksPerSecond) {
        rep_hi += 1;
        rep_lo -= kTicksPerSecond;
      }
    }
    ts.tv_sec = static_cast<decltype(ts.tv_sec)>(rep_hi);
    if (ts.tv_sec == rep_hi) {  // no time_t narrowing
      ts.tv_nsec = rep_lo / kTicksPerNanosecond;
      return ts;
    }
  }
  if (d >= ZeroDuration()) {
    ts.tv_sec = std::numeric_limits<time_t>::max();
    ts.tv_nsec = 1000 * 1000 * 1000 - 1;
  } else {
    ts.tv_sec = std::numeric_limits<time_t>::min();
    ts.tv_nsec = 0;
  }
  return ts;
}